

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

bool __thiscall
FIX::DataDictionary::getGroup
          (DataDictionary *this,string *msg,int field,int *delim,DataDictionary **pDataDictionary)

{
  DataDictionary *pDVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  int local_2c;
  
  local_2c = field;
  cVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>_>_>_>
          ::find(&(this->m_groups)._M_t,&local_2c);
  if (((_Rb_tree_header *)cVar2._M_node != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header) &&
     (cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_FIX::DataDictionary_*>_>_>_>
                      *)&cVar2._M_node[1]._M_parent,msg),
     cVar3._M_node != (_Base_ptr)&cVar2._M_node[1]._M_left)) {
    pDVar1 = (DataDictionary *)cVar3._M_node[2]._M_parent;
    *delim = cVar3._M_node[2]._M_color;
    *pDataDictionary = pDVar1;
    return true;
  }
  return false;
}

Assistant:

bool getGroup(const std::string &msg, int field, int &delim, const DataDictionary *&pDataDictionary) const {
    FieldToGroup::const_iterator i = m_groups.find(field);
    if (i == m_groups.end()) {
      return false;
    }

    const FieldPresenceMap &presenceMap = i->second;

    FieldPresenceMap::const_iterator iter = presenceMap.find(msg);
    if (iter == presenceMap.end()) {
      return false;
    }

    std::pair<int, DataDictionary *> pair = iter->second;
    delim = pair.first;
    pDataDictionary = pair.second;
    return true;
  }